

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::Renderer::renderCard(Renderer *this,Position *position,Card *card)

{
  GraphicsSystem *pGVar1;
  Area AVar2;
  uint local_2c;
  Position local_28;
  undefined8 local_20;
  
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_2c = (this->cardsId).t;
  AVar2 = getCardTextureArea(this,card);
  local_28 = AVar2.position;
  local_20 = 0x680000004b;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_2c,position);
  return;
}

Assistant:

void Renderer::renderCard(const Position& position, const Card& card) const {
    graphicsSystem->renderTexture(
        cardsId, position, getCardTextureArea(card));
}